

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

long cm_zlib_inflateMark(z_streamp strm)

{
  internal_state *piVar1;
  int iVar2;
  uint local_30;
  uint local_2c;
  inflate_state *state;
  z_streamp strm_local;
  
  iVar2 = inflateStateCheck(strm);
  if (iVar2 == 0) {
    piVar1 = strm->state;
    if (*(int *)(piVar1 + 8) == 0x3f43) {
      local_2c = *(uint *)(piVar1 + 0x5c);
    }
    else {
      if (*(int *)(piVar1 + 8) == 0x3f4c) {
        local_30 = *(int *)(piVar1 + 0x1bf0) - *(int *)(piVar1 + 0x5c);
      }
      else {
        local_30 = 0;
      }
      local_2c = local_30;
    }
    strm_local = (z_streamp)((long)*(int *)(piVar1 + 0x1bec) * 0x10000 + (ulong)local_2c);
  }
  else {
    strm_local = (z_streamp)0xffffffffffff0000;
  }
  return (long)strm_local;
}

Assistant:

long ZEXPORT inflateMark(z_streamp strm) {
    struct inflate_state FAR *state;

    if (inflateStateCheck(strm))
        return -(1L << 16);
    state = (struct inflate_state FAR *)strm->state;
    return (long)(((unsigned long)((long)state->back)) << 16) +
        (state->mode == COPY ? state->length :
            (state->mode == MATCH ? state->was - state->length : 0));
}